

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall cbtTaskSchedulerDefault::waitJobs(cbtTaskSchedulerDefault *this)

{
  cbtSpinMutex *this_00;
  int iVar1;
  ThreadLocalStorage *pTVar2;
  IJob *pIVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  int iVar6;
  int iVar7;
  int i;
  long lVar8;
  long lStack_50;
  CProfileSample __profile;
  
  CProfileSample::CProfileSample((CProfileSample *)&__profile,"waitJobs");
  iVar7 = 0;
  for (lVar8 = 0; lVar8 < this->m_numActiveJobQueues; lVar8 = lVar8 + 1) {
    while( true ) {
      pIVar3 = JobQueue::consumeJob((this->m_jobQueues).m_data + lVar8);
      if (pIVar3 == (IJob *)0x0) break;
      (**pIVar3->_vptr_IJob)(pIVar3,0);
      iVar7 = iVar7 + 1;
    }
  }
  setWorkerDirectives(this,kStayAwakeButIdle);
  uVar4 = cbtClock::getTimeMicroseconds(&this->m_clock);
  iVar6 = 0;
  lStack_50 = 1;
  do {
    for (; lStack_50 < this->m_numThreads; lStack_50 = lStack_50 + 1) {
      pTVar2 = (this->m_threadLocalStorage).m_data;
      this_00 = &pTVar2[lStack_50].m_mutex;
      cbtSpinMutex::lock(this_00);
      iVar1 = pTVar2[lStack_50].m_numJobsFinished;
      cbtSpinMutex::unlock(this_00);
      iVar6 = iVar6 + iVar1;
    }
    if (iVar6 + iVar7 == this->m_numJobs) break;
    uVar5 = cbtClock::getTimeMicroseconds(&this->m_clock);
    lStack_50 = 1;
    iVar6 = 0;
  } while (uVar5 - uVar4 < 0x186a1);
  CProfileSample::~CProfileSample((CProfileSample *)&__profile);
  return;
}

Assistant:

void waitJobs()
	{
		BT_PROFILE("waitJobs");
		// have the main thread work until the job queues are empty
		int numMainThreadJobsFinished = 0;
		for (int i = 0; i < m_numActiveJobQueues; ++i)
		{
			while (IJob* job = m_jobQueues[i].consumeJob())
			{
				job->executeJob(0);
				numMainThreadJobsFinished++;
			}
		}

		// done with jobs for now, tell workers to rest (but not sleep)
		setWorkerDirectives(WorkerThreadDirectives::kStayAwakeButIdle);

		cbtU64 clockStart = m_clock.getTimeMicroseconds();
		// wait for workers to finish any jobs in progress
		while (true)
		{
			int numWorkerJobsFinished = 0;
			for (int iThread = kFirstWorkerThreadId; iThread < m_numThreads; ++iThread)
			{
				ThreadLocalStorage* storage = &m_threadLocalStorage[iThread];
				storage->m_mutex.lock();
				numWorkerJobsFinished += storage->m_numJobsFinished;
				storage->m_mutex.unlock();
			}
			if (numWorkerJobsFinished + numMainThreadJobsFinished == m_numJobs)
			{
				break;
			}
			cbtU64 timeElapsed = m_clock.getTimeMicroseconds() - clockStart;
			cbtAssert(timeElapsed < 1000);
			if (timeElapsed > 100000)
			{
				break;
			}
			cbtSpinPause();
		}
	}